

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
* __thiscall
phmap::priv::btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>>::
insert_hint_unique<int_const&>
          (pair<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>,_bool>
           *__return_storage_ptr__,
          btree<phmap::priv::set_params<int,std::greater<int>,std::allocator<int>,256,false>> *this,
          iterator position,key_type *key,int *args)

{
  int iVar1;
  btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
  *pbVar2;
  iterator iVar3;
  iterator prev;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_58;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
  local_48;
  
  pbVar2 = position.node;
  iVar1 = position.position;
  local_58.node = pbVar2;
  local_58.position = iVar1;
  if (*(long *)(this + 0x10) == 0) {
LAB_00273454:
    insert_unique<int_const&>(__return_storage_ptr__,this,key,args);
  }
  else {
    iVar3 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
            ::end((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                   *)this);
    if (iVar3.node == pbVar2 && iVar3.position == iVar1) {
LAB_002733a9:
      local_48._12_4_ = local_58._12_4_;
      local_48.position = local_58.position;
      local_48.node = local_58.node;
      iVar3 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::begin((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                       *)this);
      if (iVar3.node != pbVar2 || iVar3.position != iVar1) {
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
        ::decrement(&local_48);
        if (((ulong)local_48.node & 7) != 0) {
LAB_00273484:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                        ,0xf84,
                        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, std::greater<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
                       );
        }
        if (*(int *)(local_48.node + (long)local_48.position * 4 + 0xc) <= *key) goto LAB_00273454;
      }
    }
    else {
      if (((undefined1  [16])position & (undefined1  [16])0x7) != (undefined1  [16])0x0)
      goto LAB_00273484;
      if (*(int *)(pbVar2 + (long)iVar1 * 4 + 0xc) < *key) goto LAB_002733a9;
      if (*(int *)(pbVar2 + (long)iVar1 * 4 + 0xc) <= *key) {
        (__return_storage_ptr__->first).node = local_58.node;
        *(ulong *)&(__return_storage_ptr__->first).position =
             CONCAT44(local_58._12_4_,local_58.position);
        __return_storage_ptr__->second = false;
        return __return_storage_ptr__;
      }
      btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
      ::increment(&local_58);
      iVar3 = btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
              ::end((btree<phmap::priv::set_params<int,_std::greater<int>,_std::allocator<int>,_256,_false>_>
                     *)this);
      pbVar2 = local_58.node;
      iVar1 = local_58.position;
      if (local_58.node != iVar3.node || local_58.position != iVar3.position) {
        if (((ulong)local_58.node & 7) != 0) goto LAB_00273484;
        if (*key <= *(int *)(local_58.node + (long)local_58.position * 4 + 0xc)) goto LAB_00273454;
      }
    }
    iVar3.position = iVar1;
    iVar3.node = pbVar2;
    iVar3._12_4_ = 0;
    iVar3 = internal_emplace<int_const&>(this,iVar3,args);
    (__return_storage_ptr__->first).node = iVar3.node;
    (__return_storage_ptr__->first).position = iVar3.position;
    __return_storage_ptr__->second = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto btree<P>::insert_hint_unique(iterator position, const key_type &key,
                                             Args &&... args)
        -> std::pair<iterator, bool> {
        if (!empty()) {
            if (position == end() || compare_keys(key, position.key())) {
                iterator prev = position;
                if (position == begin() || compare_keys((--prev).key(), key)) {
                    // prev.key() < key < position.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else if (compare_keys(position.key(), key)) {
                ++position;
                if (position == end() || compare_keys(key, position.key())) {
                    // {original `position`}.key() < key < {current `position`}.key()
                    return {internal_emplace(position, std::forward<Args>(args)...), true};
                }
            } else {
                // position.key() == key
                return {position, false};
            }
        }
        return insert_unique(key, std::forward<Args>(args)...);
    }